

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O3

MPP_RET append_interview_list
                  (H264_DpbBuf_t *p_Dpb,RK_S32 currPicStructure,RK_S32 list_idx,
                  H264_FrameStore_t **list,RK_S32 *listXsize,RK_S32 currPOC,RK_S32 curr_layer_id,
                  RK_S32 anchor_pic_flag)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  undefined4 in_register_00000034;
  undefined4 in_register_0000008c;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int in_stack_00000018;
  
  if (anchor_pic_flag < 0) {
    if (((byte)h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_init","value error(%d).\n",(char *)0x0,0x3c6);
      return MPP_ERR_VALUE;
    }
    return MPP_ERR_VALUE;
  }
  uVar5 = (ulong)((int)list != 0) * 0x10;
  lVar4 = *(long *)(CONCAT44(in_register_00000034,currPicStructure) + 0xa08);
  uVar6 = uVar5 | 0x1068;
  lVar7 = uVar5 + 0x1060;
  if (in_stack_00000018 != 0) {
    uVar6 = uVar5 + 0x1048;
    lVar7 = uVar5 + 0x1040;
  }
  uVar1 = *(uint *)(*(long *)(lVar4 + lVar7) + (ulong)(uint)anchor_pic_flag * 4);
  piVar3 = *(int **)(*(long *)(lVar4 + uVar6) + (ulong)(uint)anchor_pic_flag * 8);
  if (list_idx == 1) {
    if ((p_Dpb->size & 1) == 0) {
      return MPP_OK;
    }
    lVar4 = 200;
    lVar7 = 0x58;
  }
  else if (list_idx == 3) {
    if (p_Dpb->size != 3) {
      return MPP_OK;
    }
    lVar4 = 0xc4;
    lVar7 = 0x50;
  }
  else {
    if (list_idx != 2) {
      return MPP_OK;
    }
    if ((p_Dpb->size & 2) == 0) {
      return MPP_OK;
    }
    lVar4 = 0xcc;
    lVar7 = 0x60;
  }
  lVar7 = *(long *)((long)&p_Dpb->size + lVar7);
  lVar8 = 4;
  if (*(char *)(lVar7 + 0xc0) != '\0') {
    lVar8 = lVar4;
  }
  if ((((&p_Dpb->init_done)[list_idx == 2] != 0) && (*(int *)(lVar7 + lVar8) == curr_layer_id)) &&
     (0 < (int)uVar1)) {
    if (*piVar3 != p_Dpb->max_long_term_pic_idx) {
      uVar6 = 1;
      do {
        uVar5 = uVar6;
        if (uVar1 == uVar5) break;
        uVar6 = uVar5 + 1;
      } while (piVar3[uVar5] != p_Dpb->max_long_term_pic_idx);
      if (uVar1 <= uVar5) {
        return MPP_OK;
      }
    }
    iVar2 = *(int *)CONCAT44(in_register_0000008c,currPOC);
    *(H264_DpbBuf_t **)(listXsize + (long)iVar2 * 2) = p_Dpb;
    *(int *)CONCAT44(in_register_0000008c,currPOC) = iVar2 + 1;
  }
  return MPP_OK;
}

Assistant:

static MPP_RET append_interview_list(H264_DpbBuf_t *p_Dpb,
                                     RK_S32 currPicStructure, RK_S32 list_idx, H264_FrameStore_t **list,
                                     RK_S32 *listXsize, RK_S32 currPOC, RK_S32 curr_layer_id, RK_S32 anchor_pic_flag)
{
    RK_S32 poc = 0;
    RK_S32 fld_idx = 0;
    RK_U32 pic_avail = 0;
    RK_S32 num_ref_views = 0;
    RK_S32 *ref_view_id = NULL;
    MPP_RET ret = MPP_ERR_UNKNOW;
    RK_S32 iVOIdx = curr_layer_id;
    H264_FrameStore_t *fs = p_Dpb->fs_ilref[0];
    H264dVideoCtx_t *p_Vid = p_Dpb->p_Vid;

    VAL_CHECK(ret, iVOIdx >= 0); //!< Error: iVOIdx: %d is not less than 0
    if (anchor_pic_flag) {
        num_ref_views = list_idx ? p_Vid->active_subsps->num_anchor_refs_l1[iVOIdx] : p_Vid->active_subsps->num_anchor_refs_l0[iVOIdx];
        ref_view_id = list_idx ? p_Vid->active_subsps->anchor_ref_l1[iVOIdx] : p_Vid->active_subsps->anchor_ref_l0[iVOIdx];
    } else {
        num_ref_views = list_idx ? p_Vid->active_subsps->num_non_anchor_refs_l1[iVOIdx] : p_Vid->active_subsps->num_non_anchor_refs_l0[iVOIdx];
        ref_view_id = list_idx ? p_Vid->active_subsps->non_anchor_ref_l1[iVOIdx] : p_Vid->active_subsps->non_anchor_ref_l0[iVOIdx];
    }

    if (currPicStructure == BOTTOM_FIELD)
        fld_idx = 1;
    else
        fld_idx = 0;

    if (currPicStructure == FRAME) {
        pic_avail = (fs->is_used == 3);
        if (pic_avail) {
            poc = fs->frame->is_mmco_5 ? fs->frame->poc_mmco5 : fs->frame->poc;
        }
    } else if (currPicStructure == TOP_FIELD) {
        pic_avail = fs->is_used & 1;
        if (pic_avail) {
            poc = fs->top_field->is_mmco_5 ? fs->top_field->top_poc_mmco5 : fs->top_field->poc;
        }
    } else if (currPicStructure == BOTTOM_FIELD) {
        pic_avail = fs->is_used & 2;
        if (pic_avail) {
            poc = fs->bottom_field->is_mmco_5 ? fs->bottom_field->bot_poc_mmco5 : fs->bottom_field->poc;
        }
    } else {
        pic_avail = 0;
    }

    if (pic_avail && fs->inter_view_flag[fld_idx]) {
        if (poc == currPOC) {
            if (is_view_id_in_ref_view_list(fs->view_id, ref_view_id, num_ref_views)) {
                //!< add one inter-view reference;
                list[*listXsize] = fs;
                //!< next;
                (*listXsize)++;
            }
        }
    }
    return ret = MPP_OK;
__FAILED:
    return ret;
}